

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_dsc.c
# Opt level: O0

int get_dsc_leb_entries(Dwarf_Debug dbg,Dwarf_Small *blockpointer,Dwarf_Unsigned blocklen,
                       int dounsigned,Dwarf_Dsc_Entry_s *ary,size_t *arraycount,Dwarf_Error *error)

{
  int iVar1;
  size_t *psVar2;
  Dwarf_Dsc_Entry_s *arye_1;
  Dwarf_Unsigned DStack_158;
  int lu_res_7;
  Dwarf_Signed lu_local_7;
  Dwarf_Unsigned lu_leblen_7;
  Dwarf_Signed DStack_140;
  int lu_res_6;
  Dwarf_Signed lu_local_6;
  Dwarf_Unsigned lu_leblen_6;
  Dwarf_Signed DStack_128;
  int lu_res_5;
  Dwarf_Signed lu_local_5;
  Dwarf_Unsigned lu_leblen_5;
  long lStack_110;
  int lu_res_4;
  Dwarf_Signed lu_local_4;
  Dwarf_Unsigned lu_leblen_4;
  Dwarf_Unsigned leblen;
  Dwarf_Signed high_1;
  Dwarf_Signed low_1;
  Dwarf_Signed dsc_1;
  Dwarf_Dsc_Entry_s *arye;
  Dwarf_Unsigned DStack_d0;
  int lu_res_3;
  Dwarf_Unsigned lu_local_3;
  Dwarf_Unsigned lu_leblen_3;
  Dwarf_Unsigned DStack_b8;
  int lu_res_2;
  Dwarf_Unsigned lu_local_2;
  Dwarf_Unsigned lu_leblen_2;
  Dwarf_Unsigned DStack_a0;
  int lu_res_1;
  Dwarf_Unsigned lu_local_1;
  Dwarf_Unsigned lu_leblen_1;
  Dwarf_Unsigned DStack_88;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned high;
  Dwarf_Unsigned low;
  Dwarf_Unsigned dsc;
  size_t iarraycount;
  size_t larraycount;
  Dwarf_Small *endp;
  Dwarf_Small *p;
  size_t *arraycount_local;
  Dwarf_Dsc_Entry_s *ary_local;
  Dwarf_Unsigned DStack_28;
  int dounsigned_local;
  Dwarf_Unsigned blocklen_local;
  Dwarf_Small *blockpointer_local;
  Dwarf_Debug dbg_local;
  
  larraycount = (size_t)(blockpointer + blocklen);
  iarraycount = 0;
  dsc = *arraycount;
  endp = blockpointer;
  p = (Dwarf_Small *)arraycount;
  arraycount_local = (size_t *)ary;
  ary_local._4_4_ = dounsigned;
  DStack_28 = blocklen;
  blocklen_local = (Dwarf_Unsigned)blockpointer;
  blockpointer_local = (Dwarf_Small *)dbg;
  if (ary == (Dwarf_Dsc_Entry_s *)0x0) {
    if (dsc != 0) {
      _dwarf_error(dbg,error,0x161);
      return 1;
    }
  }
  else if (dsc == 0) {
    _dwarf_error(dbg,error,0x161);
    return 1;
  }
  if (dounsigned == 0) {
    while (endp < larraycount) {
      low_1 = 0;
      high_1 = 0;
      leblen = 0;
      lu_leblen_4 = 0;
      if ((arraycount_local != (size_t *)0x0) && (dsc <= iarraycount)) {
        _dwarf_error((Dwarf_Debug)blockpointer_local,error,0x161);
        return 1;
      }
      lu_local_4 = 0;
      lStack_110 = 0;
      lu_leblen_5._4_4_ = 0;
      lu_leblen_5._4_4_ =
           dwarf_decode_signed_leb128
                     ((char *)endp,(Dwarf_Unsigned *)&lu_local_4,&stack0xfffffffffffffef0,
                      (char *)larraycount);
      if (lu_leblen_5._4_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)blockpointer_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f");
        return 1;
      }
      lu_leblen_4 = lu_local_4;
      low_1 = lStack_110;
      endp = endp + lu_local_4;
      if (lStack_110 == 0) {
        lu_local_5 = 0;
        DStack_128 = 0;
        lu_leblen_6._4_4_ = 0;
        lu_leblen_6._4_4_ =
             dwarf_decode_signed_leb128
                       ((char *)endp,(Dwarf_Unsigned *)&lu_local_5,&stack0xfffffffffffffed8,
                        (char *)larraycount);
        if (lu_leblen_6._4_4_ == 1) {
          _dwarf_error_string((Dwarf_Debug)blockpointer_local,error,0x149,
                              "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f");
          return 1;
        }
        lu_leblen_4 = lu_local_5;
        high_1 = DStack_128;
        endp = endp + lu_local_5;
      }
      else {
        lu_local_6 = 0;
        DStack_140 = 0;
        lu_leblen_7._4_4_ = 0;
        lu_leblen_7._4_4_ =
             dwarf_decode_signed_leb128
                       ((char *)endp,(Dwarf_Unsigned *)&lu_local_6,&stack0xfffffffffffffec0,
                        (char *)larraycount);
        if (lu_leblen_7._4_4_ == 1) {
          _dwarf_error_string((Dwarf_Debug)blockpointer_local,error,0x149,
                              "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f");
          return 1;
        }
        lu_leblen_4 = lu_local_6;
        high_1 = DStack_140;
        endp = endp + lu_local_6;
        lu_local_7 = 0;
        DStack_158 = 0;
        iVar1 = dwarf_decode_signed_leb128
                          ((char *)endp,(Dwarf_Unsigned *)&lu_local_7,
                           (Dwarf_Signed *)&stack0xfffffffffffffea8,(char *)larraycount);
        if (iVar1 == 1) {
          _dwarf_error_string((Dwarf_Debug)blockpointer_local,error,0x149,
                              "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f");
          return 1;
        }
        lu_leblen_4 = lu_local_7;
        leblen = DStack_158;
        endp = endp + lu_local_7;
      }
      if (arraycount_local != (size_t *)0x0) {
        psVar2 = arraycount_local + iarraycount * 5;
        *(short *)psVar2 = (short)low_1;
        psVar2[3] = high_1;
        psVar2[4] = leblen;
      }
      iarraycount = iarraycount + 1;
    }
  }
  else {
    while (endp < larraycount) {
      low = 0;
      high = 0;
      lu_leblen = 0;
      if ((arraycount_local != (size_t *)0x0) && (dsc <= iarraycount)) {
        _dwarf_error((Dwarf_Debug)blockpointer_local,error,0x161);
        return 1;
      }
      lu_local = 0;
      DStack_88 = 0;
      lu_leblen_1._4_4_ = 0;
      lu_leblen_1._4_4_ =
           dwarf_decode_leb128((char *)endp,&lu_local,&stack0xffffffffffffff78,(char *)larraycount);
      if (lu_leblen_1._4_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)blockpointer_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
        return 1;
      }
      low = DStack_88;
      endp = endp + lu_local;
      if (DStack_88 == 0) {
        lu_local_1 = 0;
        DStack_a0 = 0;
        lu_leblen_2._4_4_ = 0;
        lu_leblen_2._4_4_ =
             dwarf_decode_leb128((char *)endp,&lu_local_1,&stack0xffffffffffffff60,
                                 (char *)larraycount);
        if (lu_leblen_2._4_4_ == 1) {
          _dwarf_error_string((Dwarf_Debug)blockpointer_local,error,0x149,
                              "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
          return 1;
        }
        high = DStack_a0;
        endp = endp + lu_local_1;
      }
      else {
        lu_local_2 = 0;
        DStack_b8 = 0;
        lu_leblen_3._4_4_ = 0;
        lu_leblen_3._4_4_ =
             dwarf_decode_leb128((char *)endp,&lu_local_2,&stack0xffffffffffffff48,
                                 (char *)larraycount);
        if (lu_leblen_3._4_4_ == 1) {
          _dwarf_error_string((Dwarf_Debug)blockpointer_local,error,0x149,
                              "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
          return 1;
        }
        high = DStack_b8;
        endp = endp + lu_local_2;
        lu_local_3 = 0;
        DStack_d0 = 0;
        arye._4_4_ = 0;
        arye._4_4_ = dwarf_decode_leb128((char *)endp,&lu_local_3,&stack0xffffffffffffff30,
                                         (char *)larraycount);
        if (arye._4_4_ == 1) {
          _dwarf_error_string((Dwarf_Debug)blockpointer_local,error,0x149,
                              "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
          return 1;
        }
        lu_leblen = DStack_d0;
        endp = endp + lu_local_3;
      }
      if (arraycount_local != (size_t *)0x0) {
        dsc_1 = (Dwarf_Signed)(arraycount_local + iarraycount * 5);
        *(short *)dsc_1 = (short)low;
        *(Dwarf_Unsigned *)(dsc_1 + 8) = high;
        *(Dwarf_Unsigned *)(dsc_1 + 0x10) = lu_leblen;
      }
      iarraycount = iarraycount + 1;
    }
  }
  if (arraycount_local == (size_t *)0x0) {
    *(size_t *)p = iarraycount;
  }
  else if (dsc != iarraycount) {
    _dwarf_error((Dwarf_Debug)blockpointer_local,error,0x161);
    return 1;
  }
  return 0;
}

Assistant:

static int
get_dsc_leb_entries(Dwarf_Debug dbg,
    Dwarf_Small    * blockpointer,
    Dwarf_Unsigned   blocklen,
    int dounsigned,
    struct Dwarf_Dsc_Entry_s *ary,
    size_t         * arraycount,
    Dwarf_Error    * error)
{
    Dwarf_Small *p = blockpointer;
    Dwarf_Small *endp = blockpointer + blocklen;
    size_t larraycount = 0;
    size_t iarraycount = *arraycount;

    if (!ary) {
        if (iarraycount) {
            /* Internal botch calling this static function. */
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        } else {}
    } else {
        if (!iarraycount) {
            /* Internal botch calling this static function. */
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        } else {}
    }
    if (dounsigned) {
        while (p < endp)  {
            Dwarf_Unsigned dsc = 0;
            Dwarf_Unsigned low = 0;
            Dwarf_Unsigned high = 0;

            if (ary && (larraycount >= iarraycount)) {
                _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
                return DW_DLV_ERROR;
            }
            DECODE_LEB128_UWORD_CK(p,dsc,
                dbg,error,endp);
            if (!dsc) {
                DECODE_LEB128_UWORD_CK(p,low,
                    dbg,error,endp);
            } else {
                DECODE_LEB128_UWORD_CK(p,low,
                    dbg,error,endp);
                DECODE_LEB128_UWORD_CK(p,high,
                    dbg,error,endp);
            }
            if (ary) {
                struct Dwarf_Dsc_Entry_s *arye =
                    ary+larraycount;

                /*  type reads the same as uleb and leb because
                    it is only zero or one. */
                arye->dsc_type = (Dwarf_Half)dsc;
                arye->dsc_low_u = low;
                arye->dsc_high_u = high;
            }
            larraycount++;
        }
    } else {
        while (p < endp)  {
            Dwarf_Signed dsc = 0;
            Dwarf_Signed low = 0;
            Dwarf_Signed high = 0;
            Dwarf_Unsigned leblen = 0;

            (void)leblen;
            if (ary && (larraycount >= iarraycount)) {
                _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
                return DW_DLV_ERROR;
            }
            DECODE_LEB128_SWORD_LEN_CK(p,dsc,
                leblen,dbg,error,endp);
            if (!dsc) {
                DECODE_LEB128_SWORD_LEN_CK(p,low,
                    leblen,dbg,error,endp);
            } else {
                DECODE_LEB128_SWORD_LEN_CK(p,low,
                    leblen,dbg,error,endp);
                DECODE_LEB128_SWORD_LEN_CK(p,high,
                    leblen,dbg,error,endp);
            }
            if (ary) {
                struct Dwarf_Dsc_Entry_s *arye =
                    ary+larraycount;

                /*  type reads the same as uleb and leb because
                    it is only zero or one. */
                arye->dsc_type = (Dwarf_Half)dsc;
                arye->dsc_low_s = low;
                arye->dsc_high_s = high;
            }
            larraycount++;
        }
    }
    if (ary) {
        /*  Just verify this recount matches original */
        if (iarraycount != larraycount) {
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        }
    } else {
        /*  This matters for first call with
            ary 0 and iarraycount 0 as we are generating the
            count. */
        *arraycount = larraycount;
    }
    return DW_DLV_OK;
}